

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlDtdPtr xmlIOParseDTD(xmlSAXHandlerPtr sax,xmlParserInputBufferPtr input,xmlCharEncoding enc)

{
  xmlParserCtxtPtr ctxt_00;
  xmlParserInputPtr input_00;
  xmlParserInputPtr pinput;
  xmlParserCtxtPtr ctxt;
  xmlDtdPtr ret;
  xmlCharEncoding enc_local;
  xmlParserInputBufferPtr input_local;
  xmlSAXHandlerPtr sax_local;
  
  if (input == (xmlParserInputBufferPtr)0x0) {
    sax_local = (xmlSAXHandlerPtr)0x0;
  }
  else {
    ctxt_00 = xmlNewSAXParserCtxt(sax,(void *)0x0);
    if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
      xmlFreeParserInputBuffer(input);
      sax_local = (xmlSAXHandlerPtr)0x0;
    }
    else {
      xmlCtxtSetOptions(ctxt_00,4);
      input_00 = xmlNewIOInputStream(ctxt_00,input,XML_CHAR_ENCODING_NONE);
      if (input_00 == (xmlParserInputPtr)0x0) {
        xmlFreeParserInputBuffer(input);
        xmlFreeParserCtxt(ctxt_00);
        sax_local = (xmlSAXHandlerPtr)0x0;
      }
      else {
        if (enc != XML_CHAR_ENCODING_NONE) {
          xmlSwitchEncoding(ctxt_00,enc);
        }
        sax_local = (xmlSAXHandlerPtr)
                    xmlCtxtParseDtd(ctxt_00,input_00,(xmlChar *)0x0,(xmlChar *)0x0);
        xmlFreeParserCtxt(ctxt_00);
      }
    }
  }
  return (xmlDtdPtr)sax_local;
}

Assistant:

xmlDtdPtr
xmlIOParseDTD(xmlSAXHandlerPtr sax, xmlParserInputBufferPtr input,
	      xmlCharEncoding enc) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr pinput = NULL;

    if (input == NULL)
	return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
        xmlFreeParserInputBuffer(input);
	return(NULL);
    }
    xmlCtxtSetOptions(ctxt, XML_PARSE_DTDLOAD);

    /*
     * generate a parser input from the I/O handler
     */

    pinput = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (pinput == NULL) {
        xmlFreeParserInputBuffer(input);
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    if (enc != XML_CHAR_ENCODING_NONE) {
        xmlSwitchEncoding(ctxt, enc);
    }

    ret = xmlCtxtParseDtd(ctxt, pinput, NULL, NULL);

    xmlFreeParserCtxt(ctxt);
    return(ret);
}